

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdStoreFloat(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86XmmReg reg1;
  x86XmmReg temp;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  reg1 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
  ctx_local._1_1_ = cmd.rA;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_cvtsd2ss,reg1,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3);
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  GenCodeStoreFloatToPointer(ctx,rEAX,reg1,ctx_local._3_1_,ctx_local._4_4_);
  return;
}

Assistant:

void GenCodeCmdStoreFloat(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86XmmReg temp = ctx.ctx.GetXmmReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, temp, sQWORD, rREG, cmd.rA * 8); // Load value

	GenCodeStoreFloatToPointer(ctx, rRAX, temp, cmd.rC, cmd.argument);
#else
	x86XmmReg temp = ctx.ctx.GetXmmReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, temp, sQWORD, rREG, cmd.rA * 8); // Load value

	x86GenCodeStoreFloatToPointer(ctx, rEAX, temp, cmd.rC, cmd.argument);
#endif
}